

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O3

bool __thiscall
ggml::cpu::aarch64::extra_buffer_type::supports_op
          (extra_buffer_type *this,ggml_backend_dev_t param_1,ggml_tensor *op)

{
  ggml_backend_buffer_type *pgVar1;
  char cVar2;
  int iVar3;
  ggml_op gVar4;
  tensor_traits *ptVar5;
  ggml_tensor *pgVar6;
  
  gVar4 = op->op;
  if (gVar4 == GGML_OP_MUL_MAT) {
    if ((((op->src[0]->buffer != (ggml_backend_buffer *)0x0) && (iVar3 = ggml_n_dims(), iVar3 == 2))
        && (pgVar1 = op->src[0]->buffer->buft, ggml_backend_cpu_aarch64_buffer_type(),
           pgVar1 == &ggml_backend_cpu_aarch64_buffer_type::ggml_backend_cpu_buffer_type_aarch64))
       && (ptVar5 = ggml_aarch64_get_optimal_repack_type(op->src[0]), ptVar5 != (tensor_traits *)0x0
          )) goto LAB_0011b21f;
    gVar4 = op->op;
  }
  if (gVar4 != GGML_OP_MUL_MAT_ID) {
    return false;
  }
  if (op->src[0]->buffer == (ggml_backend_buffer *)0x0) {
    return false;
  }
  iVar3 = ggml_n_dims();
  if (iVar3 != 3) {
    return false;
  }
  pgVar1 = op->src[0]->buffer->buft;
  ggml_backend_cpu_aarch64_buffer_type();
  if (pgVar1 != &ggml_backend_cpu_aarch64_buffer_type::ggml_backend_cpu_buffer_type_aarch64) {
    return false;
  }
  ptVar5 = ggml_aarch64_get_optimal_repack_type(op->src[0]);
  if (ptVar5 == (tensor_traits *)0x0) {
    return false;
  }
LAB_0011b21f:
  pgVar6 = op->src[1];
  if (pgVar6->buffer != (ggml_backend_buffer *)0x0) {
    cVar2 = ggml_backend_buft_is_host(pgVar6->buffer->buft);
    if (cVar2 == '\0') {
      return false;
    }
    pgVar6 = op->src[1];
  }
  if (pgVar6->type != GGML_TYPE_F32) {
    return false;
  }
  return true;
}

Assistant:

bool supports_op(ggml_backend_dev_t, const struct ggml_tensor * op) override {
        if (    op->op == GGML_OP_MUL_MAT &&
                op->src[0]->buffer &&
                (ggml_n_dims(op->src[0]) == 2) &&
                op->src[0]->buffer->buft == ggml_backend_cpu_aarch64_buffer_type() &&
                ggml_aarch64_get_optimal_repack_type(op->src[0])
                ) {
            if (op->src[1]->buffer && !ggml_backend_buft_is_host(op->src[1]->buffer->buft)) {
                return false;
            }
            if (op->src[1]->type == GGML_TYPE_F32) {
                return true;
            }
            //if (op->src[1]->type == GGML_TYPE_Q8_0) {
            //    return true;
            //}
            // may be possible if Q8_0 packed...
        } else if (op->op == GGML_OP_MUL_MAT_ID
                && op->src[0]->buffer
                && (ggml_n_dims(op->src[0]) == 3)
                && op->src[0]->buffer->buft == ggml_backend_cpu_aarch64_buffer_type()
                && ggml_aarch64_get_optimal_repack_type(op->src[0])
                ) {
            if (op->src[1]->buffer && !ggml_backend_buft_is_host(op->src[1]->buffer->buft)) {
                return false;
            }
            if (op->src[1]->type == GGML_TYPE_F32) {
                return true;
            }
            //if (op->src[1]->type == GGML_TYPE_Q8_0) {
            //    return true;
            //}
        }
        return false;
    }